

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O0

Am_Text_Fragment * __thiscall
Am_Rich_Text_Data::Get_Fragment_At
          (Am_Rich_Text_Data *this,Am_Text_Index inIndex,Am_Text_Length *outRelIndex)

{
  Am_Text_Length AVar1;
  Am_Text_Fragment *local_30;
  Am_Text_Fragment *frag;
  Am_Text_Index endOfFrag;
  Am_Text_Length *outRelIndex_local;
  Am_Text_Index inIndex_local;
  Am_Rich_Text_Data *this_local;
  
  frag = (Am_Text_Fragment *)0x0;
  local_30 = this->mHeadFragment;
  while( true ) {
    if (local_30 == (Am_Text_Fragment *)0x0) {
      return (Am_Text_Fragment *)0x0;
    }
    AVar1 = Am_Text_Fragment::Length(local_30);
    frag = (Am_Text_Fragment *)(frag->mString + (AVar1 - 0x38));
    if (inIndex <= frag) break;
    local_30 = Am_Text_Fragment::Next(local_30);
  }
  AVar1 = Am_Text_Fragment::Length(local_30);
  *outRelIndex = ((AVar1 - (long)frag) + inIndex) - 1;
  return local_30;
}

Assistant:

Am_Text_Fragment *
Am_Rich_Text_Data::Get_Fragment_At(const Am_Text_Index inIndex,
                                   Am_Text_Length &outRelIndex) const
{
  Am_Text_Index endOfFrag = 0;
  Am_Text_Fragment *frag = mHeadFragment;

  while (frag != nullptr) {
    endOfFrag += frag->Length();
    if (inIndex <= endOfFrag) {
      // find the relative index
      outRelIndex = frag->Length() - endOfFrag + inIndex - 1;
      break;
    }
    frag = frag->Next();
  }
  return frag;
}